

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O2

void __thiscall Graph::prohibitTransition(Graph *this,int left,int mid,int right)

{
  vector<Edge_*,_std::allocator<Edge_*>_> *this_00;
  pointer pvVar1;
  pointer ppEVar2;
  Edge *this_01;
  bool bVar3;
  __normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_> _Var4;
  Edge *unaff_R13;
  pointer ppEVar5;
  Edge *rightEdge;
  Edge *leftEdge;
  Edge *local_40;
  Edge *local_38;
  
  pvVar1 = (this->adjList).
           super__Vector_base<std::vector<Edge_*,_std::allocator<Edge_*>_>,_std::allocator<std::vector<Edge_*,_std::allocator<Edge_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppEVar2 = *(pointer *)
             ((long)&pvVar1[mid].super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl + 8);
  for (ppEVar5 = *(pointer *)
                  &pvVar1[mid].super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl;
      ppEVar5 != ppEVar2; ppEVar5 = ppEVar5 + 1) {
    this_01 = *ppEVar5;
    bVar3 = Edge::connectsTo(this_01,left);
    if (bVar3) {
      unaff_R13 = this_01;
      local_38 = this_01;
    }
    bVar3 = Edge::connectsTo(this_01,right);
    if (bVar3) {
      local_40 = this_01;
    }
  }
  _Var4 = std::
          __find_if<__gnu_cxx::__normal_iterator<Edge**,std::vector<Edge*,std::allocator<Edge*>>>,__gnu_cxx::__ops::_Iter_equals_val<Edge*const>>
                    ((unaff_R13->neighbours).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (unaff_R13->neighbours).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&local_40);
  std::vector<Edge_*,_std::allocator<Edge_*>_>::erase
            (&unaff_R13->neighbours,(const_iterator)_Var4._M_current);
  this_00 = &local_40->neighbours;
  _Var4 = std::
          __find_if<__gnu_cxx::__normal_iterator<Edge**,std::vector<Edge*,std::allocator<Edge*>>>,__gnu_cxx::__ops::_Iter_equals_val<Edge*const>>
                    ((local_40->neighbours).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (local_40->neighbours).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&local_38);
  std::vector<Edge_*,_std::allocator<Edge_*>_>::erase(this_00,(const_iterator)_Var4._M_current);
  return;
}

Assistant:

void Graph::prohibitTransition(int left, int mid, int right) {
  Edge* leftEdge;
  Edge* rightEdge;
  for(Edge* edge: adjList[mid]) {
    if(edge->connectsTo(left)) leftEdge = edge;
    if(edge->connectsTo(right)) rightEdge = edge;
  }
  leftEdge->neighbours.erase(std::find(leftEdge->neighbours.begin(), leftEdge->neighbours.end(), rightEdge));
  rightEdge->neighbours.erase(std::find(rightEdge->neighbours.begin(), rightEdge->neighbours.end(), leftEdge));
}